

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::StmtFileNameVisitor::~StmtFileNameVisitor(StmtFileNameVisitor *this)

{
  StmtFileNameVisitor *this_local;
  
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_005956c8;
  std::__cxx11::string::~string((string *)&this->filename);
  IRVisitor::~IRVisitor(&this->super_IRVisitor);
  return;
}

Assistant:

explicit StmtFileNameVisitor(
        const std::map<const Stmt *, std::pair<std::string, uint32_t>> &stmt_fn_ln)
        : stmt_fn_ln_(stmt_fn_ln) {}